

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexDeclaration
          (OgreBinarySerializer *this,VertexData *dest)

{
  bool bVar1;
  uint16_t local_1a;
  uint16_t id;
  VertexData *dest_local;
  OgreBinarySerializer *this_local;
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    local_1a = ReadHeader(this,true);
    while (bVar1 = AtEnd(this), !bVar1 && local_1a == 0x5110) {
      ReadGeometryVertexElement(this,dest);
      bVar1 = AtEnd(this);
      if (!bVar1) {
        local_1a = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexDeclaration(VertexData *dest)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_GEOMETRY_VERTEX_ELEMENT)
        {
            ReadGeometryVertexElement(dest);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}